

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O3

bool anon_unknown.dwarf_18c00c::PatternMatchesString(char *pattern,char *str)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  
  do {
    for (; cVar1 = *pattern, cVar1 == '*'; pattern = pattern + 1) {
      if ((*str != '\0') && (bVar3 = PatternMatchesString(pattern,str + 1), bVar3)) {
        return true;
      }
    }
    if ((cVar1 == '-') || (cVar1 == '\0')) {
      return *str == '\0';
    }
    pattern = pattern + 1;
    cVar2 = *str;
    str = str + 1;
    if (cVar1 != cVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool PatternMatchesString(const char* pattern, const char* str) {
  switch (*pattern) {
    case '\0':
    case '-': return *str == '\0';
    case '*': return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
                     PatternMatchesString(pattern + 1, str);
    default:  return *pattern == *str &&
                     PatternMatchesString(pattern + 1, str + 1);
  }
}